

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

int __thiscall crnlib::qdxt5::init(qdxt5 *this,EVP_PKEY_CTX *ctx)

{
  uint *puVar1;
  undefined8 uVar2;
  int iVar3;
  color_quad_u8 y_00;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  crn_thread_id_t cVar11;
  training_vec_array *this_00;
  byte *pbVar12;
  ulong uVar13;
  color_quad<unsigned_char,_int> *this_01;
  float *pfVar14;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar15;
  undefined8 extraout_RAX;
  undefined8 in_RCX;
  dxt_pixel_block *in_RDX;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  color_quad<unsigned_char,_int> *local_a08;
  color_quad<unsigned_char,_int> *local_970;
  color_quad<unsigned_char,_int> *local_930;
  color_quad<unsigned_char,_int> *local_910;
  insert_result local_8f0;
  empty_type local_8d5;
  uint local_8d4;
  ulong uStack_8d0;
  uint i_1;
  uint64 selectors;
  dxt5_block dxt_blk;
  uint block_index_3;
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  selector_hash;
  uint cMaxEndpointClusters;
  vec2F ev_1;
  uint weight_1;
  uint cMaxWeight_1;
  int cAlphaErrorToWeight_1;
  uint dist_1;
  color_quad_u8 h_1;
  color_quad_u8 l_2;
  uint x_4;
  uint y_4;
  color_quad_u8 c_2 [16];
  uint block_index_2;
  uint block_index_1;
  uint block_x;
  uint x_3;
  uint block_y;
  uint y_3;
  vec2F ev;
  uint weight;
  uint cMaxWeight;
  int cAlphaErrorToWeight;
  uint dist;
  color_quad_u8 h;
  color_quad_u8 l_1;
  uint a;
  uint pix_x_1;
  uint x_2;
  uint pix_y_1;
  uint y_2;
  color_quad_u8 tile_pixels [64];
  uint c_1 [8];
  layout_results *layout;
  uint layout_index;
  chunk_tile_desc *tile_desc;
  uint t_1;
  chunk_encoding_desc *encoding_desc;
  float alpha_derating;
  float adaptive_tile_alpha_psnr_derating;
  double peak_snr;
  double root_mean_squared;
  double mean_squared;
  double dStack_668;
  uint t;
  double total_error;
  chunk_encoding_desc *encoding_desc_1;
  uint e;
  uint best_encoding;
  double best_peak_snr;
  long lStack_640;
  uint i;
  uint64 error;
  uint c [8];
  uint local_610;
  uint n_1;
  uint x_1;
  uint y_1;
  color_quad_u8 layout_pixels [64];
  uint y_ofs;
  uint x_ofs;
  uint height;
  uint width;
  uint l;
  layout_results layouts [9];
  color_quad_u8 *p;
  dxt_pixel_block *block;
  uint block_index;
  uint pix_x;
  uint x;
  uint outer_block_index;
  uint pix_y;
  uint y;
  color_quad_u8 chunk_pixels [64];
  uint local_dc;
  uint local_d8;
  uint chunk_x;
  uint chunk_y;
  int local_cc;
  uint level_height;
  uint level_width;
  uint num_chunks_y;
  uint num_chunks_x;
  mip_desc *level_desc;
  uint local_b0;
  uint level;
  uint next_progress_threshold;
  uint total_processed_blocks;
  uint encoding_hist [8];
  training_vec_array *training_vecs;
  undefined1 local_60 [7];
  bool debugging;
  image_u8 debug_img;
  qdxt5_params *params_local;
  dxt_pixel_block *pBlocks_local;
  uint n_local;
  qdxt5 *this_local;
  
  debug_img.m_pixel_buf._8_8_ = in_RCX;
  clear(this);
  cVar11 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar11;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,(void *)debug_img.m_pixel_buf._8_8_,0x62d);
  clusterizer<crnlib::vec<2U,_float>_>::reserve_training_vecs
            (&this->m_endpoint_clusterizer,this->m_num_blocks);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_60);
  if ((((this->m_params).m_hierarchical & 1U) == 0) || ((this->m_params).m_num_mips == 0)) {
    for (c_2[0xe].field_0 =
              (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
              (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
               )0x0; (uint)c_2[0xe].field_0 < this->m_num_blocks;
        c_2[0xe].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((int)c_2[0xe].field_0 + 1)) {
      if ((((uint)c_2[0xe].field_0 & 0x1ff) == 0) &&
         (bVar4 = update_progress(this,(uint)c_2[0xe].field_0,this->m_num_blocks - 1), !bVar4)) {
        this_local._7_1_ = 0;
        c_2[0xf].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
              )0x1;
        goto LAB_00169b09;
      }
      local_a08 = (color_quad<unsigned_char,_int> *)&x_4;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_a08);
        local_a08 = local_a08 + 1;
      } while (local_a08 != c_2 + 0xe);
      for (l_2.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                          )0x0; (uint)l_2.field_0 < 4;
          l_2.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                        ((int)l_2.field_0 + 1)) {
        for (h_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                            )0x0; (uint)h_1.field_0 < 4;
            h_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                          ((int)h_1.field_0 + 1)) {
          uVar8 = (int)h_1.field_0 + (int)l_2.field_0 * 4;
          bVar5 = color_quad<unsigned_char,_int>::operator[]
                            (this->m_pBlocks[(uint)c_2[0xe].field_0].m_pixels[(uint)l_2.field_0] +
                             (uint)h_1.field_0,(this->m_params).m_comp_index);
          color_quad<unsigned_char,_int>::set
                    ((color_quad<unsigned_char,_int> *)(&x_4 + uVar8),(uint)bVar5,0xff);
        }
      }
      color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&dist_1);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight_1);
      dxt_fast::find_representative_colors
                (0x10,(color_quad_u8 *)&x_4,(color_quad_u8 *)&dist_1,
                 (color_quad_u8 *)&cAlphaErrorToWeight_1);
      pbVar12 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&dist_1,0);
      bVar5 = *pbVar12;
      pbVar12 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight_1,0);
      uVar8 = math::square<int>((uint)bVar5 - (uint)*pbVar12);
      ev_1.m_s[1] = 1.12104e-44;
      ev_1.m_s[0] = (float)math::clamp<unsigned_int>(uVar8 >> 3,1,8);
      vec<2U,_float>::vec((vec<2U,_float> *)&stack0xfffffffffffff770);
      pbVar12 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&dist_1,0);
      bVar5 = *pbVar12;
      pfVar14 = vec<2U,_float>::operator[]((vec<2U,_float> *)&stack0xfffffffffffff770,0);
      *pfVar14 = (float)bVar5;
      pbVar12 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight_1,0);
      bVar5 = *pbVar12;
      pfVar14 = vec<2U,_float>::operator[]((vec<2U,_float> *)&stack0xfffffffffffff770,1);
      *pfVar14 = (float)bVar5;
      clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
                (&this->m_endpoint_clusterizer,(vec<2U,_float> *)&stack0xfffffffffffff770,
                 (uint)ev_1.m_s[0]);
    }
  }
  else {
    this_00 = clusterizer<crnlib::vec<2U,_float>_>::get_training_vecs(&this->m_endpoint_clusterizer)
    ;
    vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::resize
              (this_00,this->m_num_blocks,false);
    utils::zero_object<unsigned_int[8]>((uint (*) [8])&next_progress_threshold);
    level = 0;
    local_b0 = 0x200;
    for (level_desc._4_4_ = 0; level_desc._4_4_ < (this->m_params).m_num_mips;
        level_desc._4_4_ = level_desc._4_4_ + 1) {
      _num_chunks_y = (this->m_params).m_mip_desc + level_desc._4_4_;
      level_width = _num_chunks_y->m_block_width + 1 >> 1;
      level_height = _num_chunks_y->m_block_height + 1 >> 1;
      local_cc = _num_chunks_y->m_block_width << 2;
      chunk_y = _num_chunks_y->m_block_height << 2;
      uVar6 = level_width << 3;
      uVar7 = level_height << 3;
      color_quad<unsigned_char,_int>::make_black();
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_60,uVar6,uVar7,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&chunk_x);
      for (local_d8 = 0; local_d8 < level_height; local_d8 = local_d8 + 1) {
        for (local_dc = 0; local_dc < level_width; local_dc = local_dc + 1) {
          local_910 = (color_quad<unsigned_char,_int> *)&pix_y;
          do {
            color_quad<unsigned_char,_int>::color_quad(local_910);
            local_910 = local_910 + 1;
          } while (local_910 != chunk_pixels + 0x3e);
          for (outer_block_index = 0; outer_block_index < 8;
              outer_block_index = outer_block_index + 1) {
            uVar8 = math::minimum<unsigned_int>(outer_block_index + local_d8 * 8,chunk_y - 1);
            uVar6 = _num_chunks_y->m_first_block;
            uVar7 = _num_chunks_y->m_block_width;
            for (block_index = 0; block_index < 8; block_index = block_index + 1) {
              uVar9 = math::minimum<unsigned_int>(block_index + local_dc * 8,local_cc - 1);
              color_quad<unsigned_char,_int>::operator=
                        ((color_quad<unsigned_char,_int> *)
                         (&pix_y + (block_index + outer_block_index * 8)),
                         (color_quad<unsigned_char,_int> *)
                         ((long)&this->m_pBlocks[uVar6 + (uVar8 >> 2) * uVar7 + (uVar9 >> 2)].
                                 m_pixels[0][uVar9 & 3].field_0 + (ulong)((uVar8 & 3) << 4)));
            }
          }
          for (height = 0; height < 9; height = height + 1) {
            uVar8 = *(uint *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 8);
            uVar9 = *(uint *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 0xc);
            iVar10 = *(int *)(g_chunk_tile_layouts + (ulong)height * 0x14);
            iVar3 = *(int *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 4);
            local_930 = (color_quad<unsigned_char,_int> *)&x_1;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_930);
              local_930 = local_930 + 1;
            } while (local_930 != layout_pixels + 0x3e);
            for (n_1 = 0; n_1 < uVar9; n_1 = n_1 + 1) {
              for (local_610 = 0; local_610 < uVar8; local_610 = local_610 + 1) {
                color_quad<unsigned_char,_int>::operator=
                          ((color_quad<unsigned_char,_int> *)(&x_1 + (local_610 + n_1 * uVar8)),
                           (color_quad<unsigned_char,_int> *)
                           (&pix_y + (iVar10 + local_610 + (iVar3 + n_1) * 8)));
              }
            }
            c[7] = uVar8 * uVar9;
            uVar13 = (ulong)height;
            dxt_fast::compress_alpha_block
                      (c[7],(color_quad_u8 *)&x_1,&width + uVar13 * 0x14,
                       (uint *)((long)&layouts[uVar13 - 1].m_error + 4),(uint8 *)(layouts + uVar13),
                       (this->m_params).m_comp_index);
            dxt5_block::get_block_values
                      ((uint *)&error,(&width)[(ulong)height * 0x14],
                       *(uint *)((long)&layouts[(ulong)height - 1].m_error + 4));
            lStack_640 = 0;
            for (best_peak_snr._4_4_ = 0; best_peak_snr._4_4_ < c[7];
                best_peak_snr._4_4_ = best_peak_snr._4_4_ + 1) {
              pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                  ((color_quad<unsigned_char,_int> *)(&x_1 + best_peak_snr._4_4_),
                                   (this->m_params).m_comp_index);
              iVar10 = math::square<int>((uint)*pbVar12 -
                                         c[(ulong)layouts[height].m_selectors
                                                  [(ulong)best_peak_snr._4_4_ - 8] - 2]);
              lStack_640 = iVar10 + lStack_640;
            }
            *(long *)(layouts[height].m_selectors + 0x38) = lStack_640;
          }
          _e = -1.0;
          encoding_desc_1._4_4_ = 0;
          for (encoding_desc_1._0_4_ = 0; (uint)encoding_desc_1 < 8;
              encoding_desc_1._0_4_ = (uint)encoding_desc_1 + 1) {
            dStack_668 = 0.0;
            for (mean_squared._4_4_ = 0;
                mean_squared._4_4_ <
                *(uint *)(g_chunk_encodings + (ulong)(uint)encoding_desc_1 * 0x54);
                mean_squared._4_4_ = mean_squared._4_4_ + 1) {
              uVar2 = *(undefined8 *)
                       (layouts[*(uint *)((ulong)(uint)encoding_desc_1 * 0x54 + 0x26ad84 +
                                         (ulong)mean_squared._4_4_ * 0x14)].m_selectors + 0x38);
              auVar18._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar18._0_8_ = uVar2;
              auVar18._12_4_ = 0x45300000;
              dStack_668 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
                           dStack_668;
            }
            dStack_668 = dStack_668 * 0.015625;
            dVar17 = sqrt(dStack_668);
            _alpha_derating = 999999.0;
            if ((dStack_668 != 0.0) || (NAN(dStack_668))) {
              dVar17 = log10(255.0 / dVar17);
              _alpha_derating = math::clamp<double>(dVar17 * 20.0,0.0,500.0);
            }
            encoding_desc._4_4_ = 2.4;
            if (level_desc._4_4_ != 0) {
              fVar16 = powf(3.0,(float)level_desc._4_4_);
              encoding_desc._4_4_ = math::maximum<float>(0.25,2.4 / fVar16);
            }
            fVar16 = math::lerp<float,float>
                               (0.0,encoding_desc._4_4_,
                                (float)(*(int *)(g_chunk_encodings +
                                                (ulong)(uint)encoding_desc_1 * 0x54) - 1) / 3.0);
            if (_e < _alpha_derating - (double)fVar16) {
              encoding_desc_1._4_4_ = (uint)encoding_desc_1;
              _e = _alpha_derating - (double)fVar16;
            }
          }
          (&next_progress_threshold)[encoding_desc_1._4_4_] =
               (&next_progress_threshold)[encoding_desc_1._4_4_] + 1;
          for (tile_desc._4_4_ = 0;
              tile_desc._4_4_ < *(uint *)(g_chunk_encodings + (ulong)encoding_desc_1._4_4_ * 0x54);
              tile_desc._4_4_ = tile_desc._4_4_ + 1) {
            puVar1 = (uint *)((ulong)encoding_desc_1._4_4_ * 0x54 + 0x26ad74 +
                             (ulong)tile_desc._4_4_ * 0x14);
            uVar13 = (ulong)puVar1[4];
            dxt5_block::get_block_values
                      ((uint *)(tile_pixels + 0x3e),(&width)[uVar13 * 0x14],
                       *(uint *)((long)&layouts[uVar13 - 1].m_error + 4));
            local_970 = (color_quad<unsigned_char,_int> *)&pix_y_1;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_970);
              local_970 = local_970 + 1;
            } while (local_970 != tile_pixels + 0x3e);
            for (x_2 = 0; x_2 < puVar1[3]; x_2 = x_2 + 1) {
              uVar8 = puVar1[1];
              for (a = 0; a < puVar1[2]; a = a + 1) {
                uVar9 = *puVar1;
                pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                    ((color_quad<unsigned_char,_int> *)
                                     (&pix_y + (a + uVar9 + (x_2 + uVar8) * 8)),
                                     (this->m_params).m_comp_index);
                h.field_0.m_u32._1_3_ = 0;
                h.field_0.field_0.r = *pbVar12;
                color_quad<unsigned_char,_int>::set
                          ((color_quad<unsigned_char,_int> *)(&pix_y_1 + (a + x_2 * puVar1[2])),
                           (int)h.field_0,(int)h.field_0,(int)h.field_0,0xff);
                y_00.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                               tile_pixels
                               [(ulong)layouts[uVar13].m_selectors[(ulong)(a + x_2 * puVar1[2]) - 8]
                                + 0x3e].field_0.m_u32;
                this_01 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_60,
                                     a + uVar9 + local_dc * 8,x_2 + uVar8 + local_d8 * 8);
                color_quad<unsigned_char,_int>::operator=(this_01,(int)y_00.field_0);
              }
            }
            color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&dist);
            color_quad<unsigned_char,_int>::color_quad
                      ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight);
            dxt_fast::find_representative_colors
                      (puVar1[2] * puVar1[3],(color_quad_u8 *)&pix_y_1,(color_quad_u8 *)&dist,
                       (color_quad_u8 *)&cAlphaErrorToWeight);
            pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&dist,0);
            bVar5 = *pbVar12;
            pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight,0);
            uVar8 = math::square<int>((uint)bVar5 - (uint)*pbVar12);
            ev.m_s[1] = 1.12104e-44;
            ev.m_s[0] = (float)math::clamp<unsigned_int>(uVar8 >> 3,1,8);
            vec<2U,_float>::vec((vec<2U,_float> *)&block_y);
            pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&dist,0);
            bVar5 = *pbVar12;
            pfVar14 = vec<2U,_float>::operator[]((vec<2U,_float> *)&block_y,0);
            *pfVar14 = (float)bVar5;
            pbVar12 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&cAlphaErrorToWeight,0);
            bVar5 = *pbVar12;
            pfVar14 = vec<2U,_float>::operator[]((vec<2U,_float> *)&block_y,1);
            *pfVar14 = (float)bVar5;
            for (x_3 = 0; x_3 < puVar1[3] >> 2; x_3 = x_3 + 1) {
              uVar8 = local_d8 * 2 + x_3 + (puVar1[1] >> 2);
              if (uVar8 < _num_chunks_y->m_block_height) {
                for (block_index_1 = 0;
                    (block_index_1 < puVar1[2] >> 2 &&
                    (uVar9 = local_dc * 2 + block_index_1 + (*puVar1 >> 2),
                    uVar9 < _num_chunks_y->m_block_width)); block_index_1 = block_index_1 + 1) {
                  uVar6 = _num_chunks_y->m_first_block + uVar9 +
                          uVar8 * _num_chunks_y->m_block_width;
                  ppVar15 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[]
                                      (this_00,uVar6);
                  vec<2U,_float>::operator=(&ppVar15->first,(vec<2U,_float> *)&block_y);
                  fVar16 = ev.m_s[0];
                  ppVar15 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[]
                                      (this_00,uVar6);
                  ppVar15->second = (uint)fVar16;
                  level = level + 1;
                }
              }
            }
          }
          if (local_b0 <= level) {
            local_b0 = local_b0 + 0x200;
            bVar4 = update_progress(this,level,this->m_num_blocks - 1);
            if (!bVar4) {
              this_local._7_1_ = 0;
              c_2[0xf].field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                    )0x1;
              goto LAB_00169b09;
            }
          }
        }
      }
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  bVar4 = clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                    (&this->m_endpoint_clusterizer,0xffff,generate_codebook_progress_callback,this,
                     false);
  if (bVar4) {
    hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::hash_map((hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                *)(dxt_blk.m_selectors + 2));
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    dxt_blk.m_endpoints[0] = '\0';
    dxt_blk.m_endpoints[1] = '\0';
    dxt_blk.m_selectors[0] = '\0';
    dxt_blk.m_selectors[1] = '\0';
    for (; (uint)dxt_blk._0_4_ < this->m_num_blocks; dxt_blk._0_4_ = dxt_blk._0_4_ + 1) {
      if (((dxt_blk._0_4_ & 0x1ff) == 0) &&
         (bVar4 = update_progress(this,dxt_blk._0_4_,this->m_num_blocks - 1), !bVar4)) {
        this_local._7_1_ = 0;
        goto LAB_00169afd;
      }
      dxt_fast::compress_alpha_block
                ((dxt5_block *)((long)&selectors + 4),
                 (color_quad_u8 *)(this->m_pBlocks + (uint)dxt_blk._0_4_),
                 (this->m_params).m_comp_index);
      uStack_8d0 = 0;
      for (local_8d4 = 0; local_8d4 < 6; local_8d4 = local_8d4 + 1) {
        uStack_8d0 = (ulong)*(byte *)((long)&selectors + (ulong)local_8d4 + 6) <<
                     ((byte)(local_8d4 << 3) & 0x3f) | uStack_8d0;
      }
      hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
      ::insert(&local_8f0,
               (hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                *)(dxt_blk.m_selectors + 2),&stack0xfffffffffffff730,&local_8d5);
    }
    uVar6 = hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            ::size((hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    *)(dxt_blk.m_selectors + 2));
    this->m_max_selector_clusters = uVar6 + 0x80;
    update_progress(this,1,1);
    this_local._7_1_ = 1;
LAB_00169afd:
    c_2[0xf].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          )0x1;
    hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::~hash_map((hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                 *)(dxt_blk.m_selectors + 2));
  }
  else {
    this_local._7_1_ = 0;
    c_2[0xf].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          )0x1;
  }
LAB_00169b09:
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_60);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool qdxt5::init(uint n, const dxt_pixel_block* pBlocks, const qdxt5_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        image_u8 debug_img;

        const bool debugging = true;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec2F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt5_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_alpha_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors, m_params.m_comp_index);

                            uint c[dxt5_block::cMaxSelectorValues];
                            dxt5_block::get_block_values(c, layouts[l].m_low_color, layouts[l].m_high_color);

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += math::square((int)layout_pixels[i][m_params.m_comp_index] - (int)c[layouts[l].m_selectors[i]]);
                            }

                            layouts[l].m_error = error;
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            double mean_squared = total_error * (1.0f / 64.0f);
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            float adaptive_tile_alpha_psnr_derating = 2.4f;
                            //if (level)
                            //   adaptive_tile_alpha_psnr_derating = math::lerp(adaptive_tile_alpha_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));
                            if ((level) && (adaptive_tile_alpha_psnr_derating > .25f))
                            {
                                adaptive_tile_alpha_psnr_derating = math::maximum(.25f, adaptive_tile_alpha_psnr_derating / powf(3.0f, static_cast<float>(level)));
                            }

                            float alpha_derating = math::lerp(0.0f, adaptive_tile_alpha_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - alpha_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];

                            uint c[dxt5_block::cMaxSelectorValues];
                            if (debugging)
                            {
                                dxt5_block::get_block_values(c, layout.m_low_color, layout.m_high_color);
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    uint a = chunk_pixels[pix_x + pix_y * cChunkPixelWidth][m_params.m_comp_index];

                                    tile_pixels[x + y * tile_desc.m_width].set(a, a, a, 255);

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                            const int cAlphaErrorToWeight = 8;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                            vec2F ev;

                            ev[0] = l[0];
                            ev[1] = h[0];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if QDXT5_DEBUGGING
                if (debugging)
                    image_utils::write_to_file(dynamic_wstring(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 c[16];
                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        c[x + y * cDXTBlockSize].set(m_pBlocks[block_index].m_pixels[y][x][m_params.m_comp_index], 255);
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, c, l, h);

                const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                const int cAlphaErrorToWeight = 8;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                vec2F ev;

                ev[0] = l[0];
                ev[1] = h[0];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint64, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt5_block dxt_blk;
            dxt_fast::compress_alpha_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0], m_params.m_comp_index);

            uint64 selectors = 0;
            for (uint i = 0; i < dxt5_block::cNumSelectorBytes; i++)
            {
                selectors |= static_cast<uint64>(dxt_blk.m_selectors[i]) << (i * 8U);
            }

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        update_progress(1, 1);

        return true;
    }